

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int luv_spawn(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_Integer lVar3;
  uv_stream_t *handle_00;
  luv_handle_t *plVar4;
  uv_loop_t *loop;
  uint local_88;
  int flags;
  int err;
  uv_stream_t *stream;
  uv_os_fd_t fd;
  int ret;
  size_t len;
  size_t i;
  uv_process_options_t options;
  uv_process_t *handle;
  lua_State *L_local;
  
  _fd = 0;
  memset(&i,0,0x40);
  i = (size_t)exit_cb;
  options.exit_cb = (uv_exit_cb)luaL_checklstring(L,1,(size_t *)0x0);
  options.cwd._0_4_ = 0;
  luaL_checktype(L,2,5);
  lua_getfield(L,2,"args");
  iVar1 = lua_type(L,-1);
  if (iVar1 == 5) {
    _fd = lua_rawlen(L,-1);
    _fd = _fd + 1;
  }
  else {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      luv_clean_options((uv_process_options_t *)&i);
      iVar1 = luaL_argerror(L,3,"args option must be table");
      return iVar1;
    }
    _fd = 1;
  }
  options.file = (char *)malloc((_fd + 1) * 8);
  if (options.file == (char *)0x0) {
    luv_clean_options((uv_process_options_t *)&i);
    L_local._4_4_ = luaL_error(L,"Problem allocating args");
  }
  else {
    *(uv_exit_cb *)options.file = options.exit_cb;
    for (len = 1; len < _fd; len = len + 1) {
      lua_rawgeti(L,-1,len);
      pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
      *(char **)(options.file + len * 8) = pcVar2;
      lua_settop(L,-2);
    }
    pcVar2 = options.file + _fd * 8;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    lua_settop(L,-2);
    lua_getfield(L,2,"stdio");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 5) {
      _fd = lua_rawlen(L,-1);
      options.cwd._4_4_ = (undefined4)_fd;
      options._40_8_ = malloc(_fd << 4);
      if ((void *)options._40_8_ == (void *)0x0) {
        luv_clean_options((uv_process_options_t *)&i);
        iVar1 = luaL_error(L,"Problem allocating stdio");
        return iVar1;
      }
      for (len = 0; len < _fd; len = len + 1) {
        lua_rawgeti(L,-1,len + 1);
        iVar1 = lua_type(L,-1);
        if (iVar1 == 3) {
          *(undefined4 *)(options._40_8_ + len * 0x10) = 2;
          lVar3 = lua_tointegerx(L,-1,(int *)0x0);
          *(int *)(options._40_8_ + len * 0x10 + 8) = (int)lVar3;
        }
        else {
          iVar1 = lua_type(L,-1);
          if (iVar1 == 7) {
            handle_00 = luv_check_stream(L,-1);
            iVar1 = uv_fileno((uv_handle_t *)handle_00,(uv_os_fd_t *)&stream);
            if ((iVar1 == -0x16) || (iVar1 == -9)) {
              local_88 = 1;
              if ((len == 0) || (2 < len)) {
                local_88 = 0x11;
              }
              if (len != 0) {
                local_88 = local_88 | 0x20;
              }
              *(uint *)(options._40_8_ + len * 0x10) = local_88;
            }
            else {
              *(undefined4 *)(options._40_8_ + len * 0x10) = 4;
            }
            *(uv_stream_t **)(options._40_8_ + len * 0x10 + 8) = handle_00;
          }
          else {
            iVar1 = lua_type(L,-1);
            if (iVar1 != 0) {
              luv_clean_options((uv_process_options_t *)&i);
              iVar1 = luaL_argerror(L,2,"stdio table entries must be nil, uv_stream_t, or integer");
              return iVar1;
            }
            *(undefined4 *)(options._40_8_ + len * 0x10) = 0;
          }
        }
        lua_settop(L,-2);
      }
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luv_clean_options((uv_process_options_t *)&i);
        iVar1 = luaL_argerror(L,2,"stdio option must be table");
        return iVar1;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"env");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 5) {
      _fd = lua_rawlen(L,-1);
      options.args = (char **)malloc((_fd + 1) * 8);
      if (options.args == (char **)0x0) {
        luv_clean_options((uv_process_options_t *)&i);
        iVar1 = luaL_error(L,"Problem allocating env");
        return iVar1;
      }
      for (len = 0; len < _fd; len = len + 1) {
        lua_rawgeti(L,-1,len + 1);
        pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
        options.args[len] = pcVar2;
        lua_settop(L,-2);
      }
      options.args[_fd] = (char *)0x0;
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luv_clean_options((uv_process_options_t *)&i);
        iVar1 = luaL_argerror(L,2,"env option must be table");
        return iVar1;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"cwd");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 4) {
      options.env = (char **)lua_tolstring(L,-1,(size_t *)0x0);
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luv_clean_options((uv_process_options_t *)&i);
        iVar1 = luaL_argerror(L,2,"cwd option must be string");
        return iVar1;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"uid");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 3) {
      lVar3 = lua_tointegerx(L,-1,(int *)0x0);
      options.stdio._0_4_ = (undefined4)lVar3;
      options.cwd._0_4_ = (uint)options.cwd | 1;
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luv_clean_options((uv_process_options_t *)&i);
        iVar1 = luaL_argerror(L,2,"uid option must be number");
        return iVar1;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"gid");
    iVar1 = lua_type(L,-1);
    if (iVar1 == 3) {
      lVar3 = lua_tointegerx(L,-1,(int *)0x0);
      options.stdio._4_4_ = (undefined4)lVar3;
      options.cwd._0_4_ = (uint)options.cwd | 2;
    }
    else {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luv_clean_options((uv_process_options_t *)&i);
        iVar1 = luaL_argerror(L,2,"gid option must be number");
        return iVar1;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"verbatim");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      options.cwd._0_4_ = (uint)options.cwd | 4;
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"detached");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      options.cwd._0_4_ = (uint)options.cwd | 8;
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"hide");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      options.cwd._0_4_ = (uint)options.cwd | 0x10;
    }
    lua_settop(L,-2);
    options._56_8_ = luv_newuserdata(L,0x88);
    *(undefined4 *)(options._56_8_ + 0x10) = 10;
    plVar4 = luv_setup_handle(L);
    *(luv_handle_t **)options._56_8_ = plVar4;
    iVar1 = lua_type(L,3);
    if (0 < iVar1) {
      luv_check_callback(L,*(luv_handle_t **)options._56_8_,1,3);
    }
    loop = luv_loop(L);
    stream._4_4_ = uv_spawn(loop,(uv_process_t *)options._56_8_,(uv_process_options_t *)&i);
    luv_clean_options((uv_process_options_t *)&i);
    if (stream._4_4_ < 0) {
      uv_close((uv_handle_t *)options._56_8_,luv_spawn_close_cb);
      L_local._4_4_ = luv_error(L,stream._4_4_);
    }
    else {
      lua_pushinteger(L,(long)*(int *)(options._56_8_ + 0x68));
      L_local._4_4_ = 2;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int luv_spawn(lua_State* L) {
  uv_process_t* handle;
  uv_process_options_t options;
  size_t i, len = 0;
  int ret;
  luv_ctx_t* ctx = luv_context(L);

  memset(&options, 0, sizeof(options));
  options.exit_cb = exit_cb;
  options.file = luaL_checkstring(L, 1);
  options.flags = 0;

  // Make sure the 2nd argument is a table
  luaL_checktype(L, 2, LUA_TTABLE);

  // get the args list
  lua_getfield(L, 2, "args");
  // +1 for inserted command at front
  if (lua_type(L, -1) == LUA_TTABLE) {
    len = 1 + lua_rawlen(L, -1);
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 3, "args option must be table");
  }
  else {
    len = 1;
  }
  // +1 for null terminator at end
  options.args = (char**)malloc((len + 1) * sizeof(*options.args));
  if (!options.args) {
    luv_clean_options(&options);
    return luaL_error(L, "Problem allocating args");
  }
  options.args[0] = (char*)options.file;
  for (i = 1; i < len; ++i) {
    lua_rawgeti(L, -1, i);
    options.args[i] = (char*)lua_tostring(L, -1);
    lua_pop(L, 1);
  }
  options.args[len] = NULL;
  lua_pop(L, 1);

  // get the stdio list
  lua_getfield(L, 2, "stdio");
  if (lua_type(L, -1) == LUA_TTABLE) {
    options.stdio_count = len = sparse_rawlen(L, -1);
    options.stdio = (uv_stdio_container_t*)malloc(len * sizeof(*options.stdio));
    if (!options.stdio) {
      luv_clean_options(&options);
      return luaL_error(L, "Problem allocating stdio");
    }
    for (i = 0; i < len; ++i) {
      lua_rawgeti(L, -1, i + 1);
      // integers are assumed to be file descripters
      if (lua_type(L, -1) == LUA_TNUMBER) {
        options.stdio[i].flags = UV_INHERIT_FD;
        options.stdio[i].data.fd = lua_tointeger(L, -1);
      }
      // userdata is assumed to be a uv_stream_t instance
      else if (lua_type(L, -1) == LUA_TUSERDATA) {
        uv_os_fd_t fd;
        uv_stream_t* stream = luv_check_stream(L, -1);
        int err = uv_fileno((uv_handle_t*)stream, &fd);
        if (err == UV_EINVAL || err == UV_EBADF) {
          // stdin (fd 0) is read-only, stdout and stderr (fds 1 & 2) are
          // write-only, and all fds > 2 are read-write
          int flags = UV_CREATE_PIPE;
          if (i == 0 || i > 2)
            flags |= UV_READABLE_PIPE;
          if (i != 0)
            flags |= UV_WRITABLE_PIPE;
          options.stdio[i].flags = (uv_stdio_flags)flags;
        }
        else {
          options.stdio[i].flags = UV_INHERIT_STREAM;
        }
        options.stdio[i].data.stream = stream;
      }
      else if (lua_type(L, -1) == LUA_TNIL) {
        options.stdio[i].flags = UV_IGNORE;
      }
      else {
        luv_clean_options(&options);
        return luaL_argerror(L, 2, "stdio table entries must be nil, uv_stream_t, or integer");
      }
      lua_pop(L, 1);
    }
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "stdio option must be table");
  }
  lua_pop(L, 1);

  // Get the env
  lua_getfield(L, 2, "env");
  if (lua_type(L, -1) == LUA_TTABLE) {
    len = lua_rawlen(L, -1);
    options.env = (char**)malloc((len + 1) * sizeof(*options.env));
    if (!options.env) {
      luv_clean_options(&options);
      return luaL_error(L, "Problem allocating env");
    }
    for (i = 0; i < len; ++i) {
      lua_rawgeti(L, -1, i + 1);
      options.env[i] = (char*)lua_tostring(L, -1);
      lua_pop(L, 1);
    }
    options.env[len] = NULL;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "env option must be table");
  }
  lua_pop(L, 1);

  // Get the cwd
  lua_getfield(L, 2, "cwd");
  if (lua_type(L, -1) == LUA_TSTRING) {
    options.cwd = (char*)lua_tostring(L, -1);
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "cwd option must be string");
  }
  lua_pop(L, 1);

  // Check for uid
  lua_getfield(L, 2, "uid");
  if (lua_type(L, -1) == LUA_TNUMBER) {
    options.uid = lua_tointeger(L, -1);
    options.flags |= UV_PROCESS_SETUID;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "uid option must be number");
  }
  lua_pop(L, 1);

  // Check for gid
  lua_getfield(L, 2, "gid");
  if (lua_type(L, -1) == LUA_TNUMBER) {
    options.gid = lua_tointeger(L, -1);
    options.flags |= UV_PROCESS_SETGID;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "gid option must be number");
  }
  lua_pop(L, 1);

  // Check for the boolean flags
  lua_getfield(L, 2, "verbatim");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "detached");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_DETACHED;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "hide");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE;
  }
  lua_pop(L, 1);
#if LUV_UV_VERSION_GEQ(1, 24, 0)
  lua_getfield(L, 2, "hide_console");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE_CONSOLE;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "hide_gui");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE_GUI;
  }
  lua_pop(L, 1);
#endif

  // this will fill the 3rd argument with nil if it doesn't exist so that
  // the uv_process_t userdata doesn't get treated as the 3rd argument
  lua_settop(L, 3);

  handle = (uv_process_t*)luv_newuserdata(L, sizeof(*handle));
  handle->type = UV_PROCESS;
  handle->data = luv_setup_handle(L, ctx);

  if (!lua_isnoneornil(L, 3)) {
    luv_check_callback(L, (luv_handle_t*)handle->data, LUV_EXIT, 3);
  }

  ret = uv_spawn(ctx->loop, handle, &options);

  luv_clean_options(&options);
  if (ret < 0) {
    /* The async callback is required here because luajit GC may reclaim the
     * luv handle before libuv is done closing it down.
     */
    uv_close((uv_handle_t*)handle, luv_spawn_close_cb);
    return luv_error(L, ret);
  }
  lua_pushinteger(L, handle->pid);
  return 2;
}